

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.cpp
# Opt level: O1

String * __thiscall
Rml::Style::ComputedValues::font_family_abi_cxx11_
          (String *__return_storage_ptr__,ComputedValues *this)

{
  Property *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = Element::GetProperty(this->element,FontFamily);
  if (this_00 != (Property *)0x0) {
    Property::Get<std::__cxx11::string>(&local_38,this_00);
    ComputeFontFamily(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (this_00 != (Property *)0x0) {
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

String Style::ComputedValues::font_family() const
{
	if (auto p = element->GetProperty(PropertyId::FontFamily))
		return ComputeFontFamily(p->Get<String>());

	return String();
}